

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tictactoe.cpp
# Opt level: O3

void __thiscall Game::PrintBoard(Game *this)

{
  Player PVar1;
  int i;
  long lVar2;
  ostream *poVar3;
  long *plVar4;
  char cVar5;
  array<char,_9UL> symbols;
  char local_19;
  char local_18 [16];
  
  local_18[8] = '\0';
  local_18[0] = '\0';
  local_18[1] = '\0';
  local_18[2] = '\0';
  local_18[3] = '\0';
  local_18[4] = '\0';
  local_18[5] = '\0';
  local_18[6] = '\0';
  local_18[7] = '\0';
  lVar2 = 0;
  do {
    PVar1 = (this->m_board)._M_elems[lVar2];
    cVar5 = 'X';
    if (PVar1 != Cross) {
      cVar5 = ' ';
    }
    if (PVar1 == Circle) {
      cVar5 = 'O';
    }
    local_18[lVar2] = cVar5;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 9);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"     |     |     ",0x11)
  ;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
  std::ostream::put(-0x68);
  poVar3 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"  ",2);
  local_19 = local_18[0];
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_19,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"  |  ",5);
  local_19 = local_18[1];
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_19,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"  |  ",5);
  local_19 = local_18[2];
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_19,1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  poVar3 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"_____|_____|_____",0x11);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  poVar3 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"     |     |     ",0x11);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  poVar3 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"  ",2);
  local_19 = local_18[3];
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_19,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"  |  ",5);
  local_19 = local_18[4];
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_19,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"  |  ",5);
  local_19 = local_18[5];
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_19,1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  poVar3 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"_____|_____|_____",0x11);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  poVar3 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"     |     |     ",0x11);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  poVar3 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"  ",2);
  local_19 = local_18[6];
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_19,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"  |  ",5);
  local_19 = local_18[7];
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_19,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"  |  ",5);
  local_19 = local_18[8];
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_19,1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  poVar3 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"     |     |     ",0x11);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  plVar4 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
  std::ostream::put((char)plVar4);
  std::ostream::flush();
  return;
}

Assistant:

void PrintBoard() const noexcept {
            std::array<char, 9> symbols {};
            for (auto i = 0; i < 9; ++i) {
                symbols[i] = GetPlayerSymbol(m_board[i]);
            }

            std::cout 
                << "     |     |     " << std::endl
                << "  " << symbols[0] << "  |  " << symbols[1] << "  |  " << symbols[2] << std::endl
                << "_____|_____|_____" << std::endl
                << "     |     |     " << std::endl
                << "  " << symbols[3] << "  |  " << symbols[4] << "  |  " << symbols[5] << std::endl
                << "_____|_____|_____" << std::endl
                << "     |     |     " << std::endl
                << "  " << symbols[6] << "  |  " << symbols[7] << "  |  " << symbols[8] << std::endl
                << "     |     |     " << std::endl 
                << std::endl;
        }